

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SslSocket.cpp
# Opt level: O1

void __thiscall
SslTcpSocketImpl::SslTcpSocketImpl
          (SslTcpSocketImpl *this,BaseSocket *pBkref,TcpSocketImpl *pTcpSocket)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  _Invoker_type p_Var4;
  _Manager_type p_Var5;
  _Invoker_type p_Var6;
  _Invoker_type p_Var7;
  _Invoker_type p_Var8;
  _func_int__Any_data_ptr *__tmp_2;
  _Any_data __tmp_3;
  _Any_data __tmp;
  _Bind<int_(SslTcpSocketImpl::*(SslTcpSocketImpl_*,_std::_Placeholder<1>,_std::_Placeholder<2>,_std::_Placeholder<3>))(const_unsigned_char_*,_unsigned_long,_bool_&)>
  local_78;
  _Invoker_type p_Stack_60;
  SslTcpSocketImpl *local_48;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  
  TcpSocketImpl::TcpSocketImpl(&this->super_TcpSocketImpl,pBkref,pTcpSocket);
  (this->super_TcpSocketImpl).super_BaseSocketImpl._vptr_BaseSocketImpl =
       (_func_int **)&PTR__SslTcpSocketImpl_00146dd0;
  OpenSSLWrapper::SslClientContext::SslClientContext(&this->m_pClientCtx);
  this->m_bCloseReq = false;
  (this->m_fClientConnectedParam).super__Function_base._M_manager = (_Manager_type)0x0;
  (this->m_fClientConnectedParam)._M_invoker = (_Invoker_type)0x0;
  *(undefined8 *)&(this->m_fClientConnectedParam).super__Function_base._M_functor = 0;
  *(undefined8 *)((long)&(this->m_fClientConnectedParam).super__Function_base._M_functor + 8) = 0;
  (this->m_fClientConnected).super__Function_base._M_manager = (_Manager_type)0x0;
  (this->m_fClientConnected)._M_invoker = (_Invoker_type)0x0;
  *(undefined8 *)&(this->m_fClientConnected).super__Function_base._M_functor = 0;
  *(undefined8 *)((long)&(this->m_fClientConnected).super__Function_base._M_functor + 8) = 0;
  (this->m_pServerCtx).
  super__Vector_base<OpenSSLWrapper::SslServerContext,_std::allocator<OpenSSLWrapper::SslServerContext>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_pSslCon)._M_t.
  super___uniq_ptr_impl<OpenSSLWrapper::SslConnection,_std::default_delete<OpenSSLWrapper::SslConnection>_>
  ._M_t.
  super__Tuple_impl<0UL,_OpenSSLWrapper::SslConnection_*,_std::default_delete<OpenSSLWrapper::SslConnection>_>
  .super__Head_base<0UL,_OpenSSLWrapper::SslConnection_*,_false>._M_head_impl = (SslConnection *)0x0
  ;
  (this->m_pServerCtx).
  super__Vector_base<OpenSSLWrapper::SslServerContext,_std::allocator<OpenSSLWrapper::SslServerContext>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_pServerCtx).
  super__Vector_base<OpenSSLWrapper::SslServerContext,_std::allocator<OpenSSLWrapper::SslServerContext>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  *(undefined8 *)&this->m_iSslInit = 0;
  *(undefined8 *)
   ((long)&(this->m_vProtoList).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start + 4) = 0;
  (this->m_vProtoList).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_vProtoList).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_strTrustRootCert)._M_dataplus._M_p = (pointer)&(this->m_strTrustRootCert).field_2;
  (this->m_strTrustRootCert)._M_string_length = 0;
  (this->m_strTrustRootCert).field_2._M_local_buf[0] = '\0';
  (this->m_mxEnDecode).super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->m_mxEnDecode).super___mutex_base._M_mutex + 8) = 0;
  *(undefined8 *)((long)&(this->m_mxEnDecode).super___mutex_base._M_mutex + 0x10) = 0;
  (this->m_mxEnDecode).super___mutex_base._M_mutex.__data.__list.__prev =
       (__pthread_internal_list *)0x0;
  (this->m_mxEnDecode).super___mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)0x0;
  uStack_40 = 0;
  uStack_3c = 0;
  local_78._M_f =
       *(offset_in_SslTcpSocketImpl_to_subr *)
        &(this->super_TcpSocketImpl).m_fnSslInitDone.super__Function_base._M_functor;
  local_78._8_8_ =
       *(undefined8 *)
        ((long)&(this->super_TcpSocketImpl).m_fnSslInitDone.super__Function_base._M_functor + 8);
  *(SslTcpSocketImpl **)&(this->super_TcpSocketImpl).m_fnSslInitDone.super__Function_base._M_functor
       = this;
  *(undefined4 *)
   ((long)&(this->super_TcpSocketImpl).m_fnSslInitDone.super__Function_base._M_functor + 8) = 0;
  *(undefined4 *)
   ((long)&(this->super_TcpSocketImpl).m_fnSslInitDone.super__Function_base._M_functor + 0xc) = 0;
  local_78._M_bound_args.
  super__Tuple_impl<0UL,_SslTcpSocketImpl_*,_std::_Placeholder<1>,_std::_Placeholder<2>,_std::_Placeholder<3>_>
  .super__Head_base<0UL,_SslTcpSocketImpl_*,_false>._M_head_impl =
       (_Tuple_impl<0UL,_SslTcpSocketImpl_*,_std::_Placeholder<1>,_std::_Placeholder<2>,_std::_Placeholder<3>_>
        )(this->super_TcpSocketImpl).m_fnSslInitDone.super__Function_base._M_manager;
  (this->super_TcpSocketImpl).m_fnSslInitDone.super__Function_base._M_manager =
       std::
       _Function_handler<int_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Tomenz[P]Examples-SocketLib/SocketLib/SslSocket.cpp:59:23)>
       ::_M_manager;
  p_Stack_60 = (this->super_TcpSocketImpl).m_fnSslInitDone._M_invoker;
  (this->super_TcpSocketImpl).m_fnSslInitDone._M_invoker =
       std::
       _Function_handler<int_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Tomenz[P]Examples-SocketLib/SocketLib/SslSocket.cpp:59:23)>
       ::_M_invoke;
  local_48 = this;
  if (local_78._M_bound_args.
      super__Tuple_impl<0UL,_SslTcpSocketImpl_*,_std::_Placeholder<1>,_std::_Placeholder<2>,_std::_Placeholder<3>_>
      .super__Head_base<0UL,_SslTcpSocketImpl_*,_false>._M_head_impl !=
      (_Head_base<0UL,_SslTcpSocketImpl_*,_false>)0x0) {
    (*(code *)local_78._M_bound_args.
              super__Tuple_impl<0UL,_SslTcpSocketImpl_*,_std::_Placeholder<1>,_std::_Placeholder<2>,_std::_Placeholder<3>_>
              .super__Head_base<0UL,_SslTcpSocketImpl_*,_false>._M_head_impl)(&local_78,&local_78,3)
    ;
  }
  local_78._M_f = (offset_in_SslTcpSocketImpl_to_subr)DatenEncode;
  local_78._8_8_ = 0;
  local_78._M_bound_args.
  super__Tuple_impl<0UL,_SslTcpSocketImpl_*,_std::_Placeholder<1>,_std::_Placeholder<2>,_std::_Placeholder<3>_>
  .super__Head_base<0UL,_SslTcpSocketImpl_*,_false>._M_head_impl =
       (_Tuple_impl<0UL,_SslTcpSocketImpl_*,_std::_Placeholder<1>,_std::_Placeholder<2>,_std::_Placeholder<3>_>
        )(_Tuple_impl<0UL,_SslTcpSocketImpl_*,_std::_Placeholder<1>,_std::_Placeholder<2>,_std::_Placeholder<3>_>
          )this;
  std::function<int(unsigned_char_const*,unsigned_long)>::operator=
            ((function<int(unsigned_char_const*,unsigned_long)> *)
             &(this->super_TcpSocketImpl).m_fnSslEncode,
             (_Bind<int_(SslTcpSocketImpl::*(SslTcpSocketImpl_*,_std::_Placeholder<1>,_std::_Placeholder<2>))(const_unsigned_char_*,_unsigned_long)>
              *)&local_78);
  local_78._M_f = (offset_in_SslTcpSocketImpl_to_subr)DatenDecode;
  local_78._8_8_ = 0;
  local_78._M_bound_args.
  super__Tuple_impl<0UL,_SslTcpSocketImpl_*,_std::_Placeholder<1>,_std::_Placeholder<2>,_std::_Placeholder<3>_>
  .super__Head_base<0UL,_SslTcpSocketImpl_*,_false>._M_head_impl =
       (_Tuple_impl<0UL,_SslTcpSocketImpl_*,_std::_Placeholder<1>,_std::_Placeholder<2>,_std::_Placeholder<3>_>
        )(_Tuple_impl<0UL,_SslTcpSocketImpl_*,_std::_Placeholder<1>,_std::_Placeholder<2>,_std::_Placeholder<3>_>
          )this;
  std::function<int(unsigned_char_const*,unsigned_long,bool&)>::operator=
            ((function<int(unsigned_char_const*,unsigned_long,bool&)> *)
             &(this->super_TcpSocketImpl).m_fnSslDecode,&local_78);
  uVar1 = *(undefined8 *)&(this->m_fClientConnected).super__Function_base._M_functor;
  uVar2 = *(undefined8 *)((long)&(this->m_fClientConnected).super__Function_base._M_functor + 8);
  uVar3 = *(undefined8 *)
           ((long)&(this->super_TcpSocketImpl).m_fClientConnected.super__Function_base._M_functor +
           8);
  *(undefined8 *)&(this->m_fClientConnected).super__Function_base._M_functor =
       *(undefined8 *)
        &(this->super_TcpSocketImpl).m_fClientConnected.super__Function_base._M_functor;
  *(undefined8 *)((long)&(this->m_fClientConnected).super__Function_base._M_functor + 8) = uVar3;
  *(undefined8 *)&(this->super_TcpSocketImpl).m_fClientConnected.super__Function_base._M_functor =
       uVar1;
  *(undefined8 *)
   ((long)&(this->super_TcpSocketImpl).m_fClientConnected.super__Function_base._M_functor + 8) =
       uVar2;
  p_Var4 = (this->super_TcpSocketImpl).m_fClientConnected._M_invoker;
  p_Var5 = (this->m_fClientConnected).super__Function_base._M_manager;
  p_Var6 = (this->m_fClientConnected)._M_invoker;
  (this->m_fClientConnected).super__Function_base._M_manager =
       (this->super_TcpSocketImpl).m_fClientConnected.super__Function_base._M_manager;
  (this->m_fClientConnected)._M_invoker = p_Var4;
  (this->super_TcpSocketImpl).m_fClientConnected.super__Function_base._M_manager = p_Var5;
  (this->super_TcpSocketImpl).m_fClientConnected._M_invoker = p_Var6;
  uVar1 = *(undefined8 *)&(this->m_fClientConnectedParam).super__Function_base._M_functor;
  uVar2 = *(undefined8 *)
           ((long)&(this->m_fClientConnectedParam).super__Function_base._M_functor + 8);
  uVar3 = *(undefined8 *)
           ((long)&(this->super_TcpSocketImpl).m_fClientConnectedParam.super__Function_base.
                   _M_functor + 8);
  *(undefined8 *)&(this->m_fClientConnectedParam).super__Function_base._M_functor =
       *(undefined8 *)
        &(this->super_TcpSocketImpl).m_fClientConnectedParam.super__Function_base._M_functor;
  *(undefined8 *)((long)&(this->m_fClientConnectedParam).super__Function_base._M_functor + 8) =
       uVar3;
  *(undefined8 *)
   &(this->super_TcpSocketImpl).m_fClientConnectedParam.super__Function_base._M_functor = uVar1;
  *(undefined8 *)
   ((long)&(this->super_TcpSocketImpl).m_fClientConnectedParam.super__Function_base._M_functor + 8)
       = uVar2;
  p_Var7 = (this->super_TcpSocketImpl).m_fClientConnectedParam._M_invoker;
  p_Var5 = (this->m_fClientConnectedParam).super__Function_base._M_manager;
  p_Var8 = (this->m_fClientConnectedParam)._M_invoker;
  (this->m_fClientConnectedParam).super__Function_base._M_manager =
       (this->super_TcpSocketImpl).m_fClientConnectedParam.super__Function_base._M_manager;
  (this->m_fClientConnectedParam)._M_invoker = p_Var7;
  (this->super_TcpSocketImpl).m_fClientConnectedParam.super__Function_base._M_manager = p_Var5;
  (this->super_TcpSocketImpl).m_fClientConnectedParam._M_invoker = p_Var8;
  return;
}

Assistant:

SslTcpSocketImpl::SslTcpSocketImpl(BaseSocket* pBkref, TcpSocketImpl* pTcpSocket) : TcpSocketImpl(pBkref, pTcpSocket), m_bCloseReq(false), m_iSslInit(0)
{   // Switch from Tcp to Ssl/Tls
    m_fnSslInitDone = [this]() noexcept -> int { return m_iSslInit; };
    m_fnSslEncode = bind(&SslTcpSocketImpl::DatenEncode, this, _1, _2);
    m_fnSslDecode = bind(&SslTcpSocketImpl::DatenDecode, this, _1, _2, _3);

    m_fClientConnected.swap(TcpSocketImpl::m_fClientConnected);
    m_fClientConnectedParam.swap(TcpSocketImpl::m_fClientConnectedParam);
}